

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetSphereDepth
          (ON_Viewport *this,ON_Sphere *sphere,double *near_dist,double *far_dist,bool bGrowNearFar)

{
  ON_3dPoint point;
  double dVar1;
  ON_3dPoint local_48;
  byte local_2a;
  byte local_29;
  bool rc;
  double *pdStack_28;
  bool bGrowNearFar_local;
  double *far_dist_local;
  double *near_dist_local;
  ON_Sphere *sphere_local;
  ON_Viewport *this_local;
  
  local_29 = bGrowNearFar;
  pdStack_28 = far_dist;
  far_dist_local = near_dist;
  near_dist_local = (double *)sphere;
  sphere_local = (ON_Sphere *)this;
  ON_Sphere::Center(&local_48,sphere);
  point.y = local_48.y;
  point.x = local_48.x;
  point.z = local_48.z;
  local_2a = GetPointDepth(this,point,far_dist_local,pdStack_28,(bool)(local_29 & 1));
  if (((bool)local_2a) && (dVar1 = ON_Sphere::Radius(sphere), 0.0 < dVar1)) {
    if (far_dist_local != (double *)0x0) {
      dVar1 = ON_Sphere::Radius(sphere);
      *far_dist_local = *far_dist_local - dVar1;
    }
    if (pdStack_28 != (double *)0x0) {
      dVar1 = ON_Sphere::Radius(sphere);
      *pdStack_28 = dVar1 + *pdStack_28;
    }
  }
  return (bool)(local_2a & 1);
}

Assistant:

bool ON_Viewport::GetSphereDepth( 
       ON_Sphere sphere,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  bool rc = GetPointDepth( sphere.Center(), near_dist, far_dist, bGrowNearFar );
  if ( rc && sphere.Radius() > 0.0 )
  {
    if ( 0 != near_dist )
      *near_dist -= sphere.Radius();
    if ( 0 != far_dist )
      *far_dist += sphere.Radius();
  }
  return rc;
}